

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLURL.cpp
# Opt level: O3

void __thiscall xercesc_4_0::XMLURL::setURL(XMLURL *this,XMLCh *baseURL,XMLCh *relativeURL)

{
  MalformedURLException *this_00;
  bool bVar1;
  XMLURL basePart;
  XMLURL local_70;
  
  cleanUp(this);
  parse(this,relativeURL);
  bVar1 = true;
  if ((this->fProtocol != Unknown) && (this->fPath != (XMLCh *)0x0)) {
    bVar1 = *this->fPath != L'/';
  }
  if (((baseURL != (XMLCh *)0x0) && (bVar1)) && (*baseURL != L'\0')) {
    XMLURL(&local_70,baseURL,this->fMemoryManager);
    bVar1 = conglomerateWithBase(this,&local_70,false);
    if (!bVar1) {
      cleanUp(this);
      this_00 = (MalformedURLException *)__cxa_allocate_exception(0x30);
      MalformedURLException::MalformedURLException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLURL.cpp"
                 ,0x204,URL_RelativeBaseURL,this->fMemoryManager);
      __cxa_throw(this_00,&MalformedURLException::typeinfo,XMLException::~XMLException);
    }
    ~XMLURL(&local_70);
  }
  return;
}

Assistant:

void XMLURL::setURL(const XMLCh* const    baseURL
                  , const XMLCh* const    relativeURL)
{
    cleanUp();

    // Parse our URL string
    parse(relativeURL);

	//
	//  If its relative and the base is non-null and non-empty, then
	//  parse the base URL string and conglomerate them.
	//
	if (isRelative() && baseURL)
	{
		if (*baseURL)
		{
			XMLURL basePart(baseURL, fMemoryManager);
			if (!conglomerateWithBase(basePart, false))
			{
				cleanUp();
				ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_RelativeBaseURL, fMemoryManager);
			}
		}
	}
}